

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.h
# Opt level: O2

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::Swap
          (SentencePieceText_SentencePiece *this,SentencePieceText_SentencePiece *other)

{
  void *pvVar1;
  void *pvVar2;
  
  if (other == this) {
    return;
  }
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  pvVar2 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    pvVar2 = *(void **)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  if (pvVar1 != pvVar2) {
    google::protobuf::internal::GenericSwap(&this->super_MessageLite,&other->super_MessageLite);
    return;
  }
  InternalSwap(this,other);
  return;
}

Assistant:

inline void Swap(SentencePieceText_SentencePiece* other) {
    if (other == this) return;
    if (GetArena() == other->GetArena()) {
      InternalSwap(other);
    } else {
      ::PROTOBUF_NAMESPACE_ID::internal::GenericSwap(this, other);
    }
  }